

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O1

void __thiscall
TEST_MockCallTest_ignoreOtherCallsExceptForTheUnExpectedOne_TestShell::
~TEST_MockCallTest_ignoreOtherCallsExceptForTheUnExpectedOne_TestShell
          (TEST_MockCallTest_ignoreOtherCallsExceptForTheUnExpectedOne_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockCallTest, ignoreOtherCallsExceptForTheUnExpectedOne)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction(0, "lazy");
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "lazy", expectations);

    mock().expectNoCall("lazy");
    mock().ignoreOtherCalls();
    mock().actualCall("bar").withParameter("foo", 1);
    mock().actualCall("bar1").withParameter("foo", 1);
    mock().actualCall("bar2").withParameter("foo", 1);
    mock().actualCall("lazy");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}